

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomicsObject.cpp
# Opt level: O0

uint32 Js::AtomicsObject::ValidateAtomicAccess
                 (Var typedArray,Var requestIndex,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  uint32 uVar4;
  undefined4 *puVar5;
  TypedArrayBase *this;
  double dVar6;
  double dblValue;
  int32 accessIndex;
  ScriptContext *scriptContext_local;
  Var requestIndex_local;
  Var typedArray_local;
  
  bVar2 = VarIs<Js::TypedArrayBase>(typedArray);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/AtomicsObject.cpp"
                                ,0x38,"(VarIs<TypedArrayBase>(typedArray))",
                                "VarIs<TypedArrayBase>(typedArray)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = TaggedInt::Is(requestIndex);
  if (bVar2) {
    dblValue._4_4_ = TaggedInt::ToInt32(requestIndex);
  }
  else {
    BVar3 = Js::JavascriptOperators::IsUndefined(requestIndex);
    if (BVar3 == 0) {
      dblValue._4_4_ = JavascriptConversion::ToInt32_Full(requestIndex,scriptContext);
      dVar6 = JavascriptConversion::ToInteger(requestIndex,scriptContext);
      if ((dVar6 != (double)(int)dblValue._4_4_) || (NAN(dVar6) || NAN((double)(int)dblValue._4_4_))
         ) {
        JavascriptError::ThrowRangeError(scriptContext,-0x7ff5e9e1,(PCWSTR)0x0);
      }
    }
    else {
      dblValue._4_4_ = 0;
    }
  }
  if (-1 < (int)dblValue._4_4_) {
    this = VarTo<Js::TypedArrayBase>(typedArray);
    uVar4 = ArrayObject::GetLength((ArrayObject *)this);
    if ((int)dblValue._4_4_ < (int)uVar4) {
      return dblValue._4_4_;
    }
  }
  JavascriptError::ThrowRangeError(scriptContext,-0x7ff5e9e1,(PCWSTR)0x0);
}

Assistant:

uint32 AtomicsObject::ValidateAtomicAccess(Var typedArray, Var requestIndex, ScriptContext *scriptContext)
    {
        Assert(VarIs<TypedArrayBase>(typedArray));

        int32 accessIndex = -1;
        if (TaggedInt::Is(requestIndex))
        {
            accessIndex = TaggedInt::ToInt32(requestIndex);
        }
        else if(Js::JavascriptOperators::IsUndefined(requestIndex))
        {
            accessIndex = 0;
        }
        else
        {
            accessIndex = JavascriptConversion::ToInt32_Full(requestIndex, scriptContext);
            double dblValue = JavascriptConversion::ToInteger(requestIndex, scriptContext);
            if (dblValue != accessIndex)
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_InvalidTypedArrayIndex);
            }
        }

        if (accessIndex < 0 || accessIndex >= (int32)VarTo<TypedArrayBase>(typedArray)->GetLength())
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_InvalidTypedArrayIndex);
        }

        return (uint32)accessIndex;
    }